

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

FT_Error ps_mask_table_merge(PS_Mask_Table table,FT_UInt index1,FT_UInt index2,FT_Memory memory)

{
  FT_Byte *pFVar1;
  FT_UInt FVar2;
  FT_UInt FVar3;
  FT_UInt FVar4;
  undefined4 uVar5;
  FT_Error FVar6;
  uint uVar7;
  PS_Mask mask;
  PS_Mask pPVar8;
  PS_MaskRec dummy;
  FT_Byte *write;
  FT_Byte *read;
  FT_UInt pos;
  FT_Int delta;
  FT_UInt count2;
  FT_UInt count1;
  PS_Mask mask2;
  PS_Mask mask1;
  FT_UInt temp;
  FT_Error error;
  FT_Memory memory_local;
  FT_UInt index2_local;
  FT_UInt index1_local;
  PS_Mask_Table table_local;
  
  memory_local._0_4_ = index2;
  memory_local._4_4_ = index1;
  if (index2 < index1) {
    memory_local._0_4_ = index1;
    memory_local._4_4_ = index2;
  }
  if ((memory_local._4_4_ < (FT_UInt)memory_local) && ((FT_UInt)memory_local < table->num_masks)) {
    mask = table->masks + memory_local._4_4_;
    pPVar8 = table->masks + (FT_UInt)memory_local;
    read._0_4_ = mask->num_bits;
    uVar7 = pPVar8->num_bits;
    if (uVar7 != 0) {
      if ((uint)read < uVar7) {
        FVar6 = ps_mask_ensure(mask,uVar7,memory);
        if (FVar6 != 0) {
          return FVar6;
        }
        for (; (uint)read < uVar7; read._0_4_ = (uint)read + 1) {
          ps_mask_clear_bit(mask,(uint)read);
        }
      }
      write = pPVar8->bytes;
      dummy._16_8_ = mask->bytes;
      for (read._0_4_ = uVar7 + 7 >> 3; (uint)read != 0; read._0_4_ = (uint)read - 1) {
        *(byte *)dummy._16_8_ = *(byte *)dummy._16_8_ | *write;
        dummy._16_8_ = dummy._16_8_ + 1;
        write = write + 1;
      }
    }
    pPVar8->num_bits = 0;
    pPVar8->end_point = 0;
    uVar7 = (table->num_masks - 1) - (FT_UInt)memory_local;
    if (0 < (int)uVar7) {
      FVar2 = pPVar8->num_bits;
      FVar3 = pPVar8->max_bits;
      pFVar1 = pPVar8->bytes;
      FVar4 = pPVar8->end_point;
      uVar5 = *(undefined4 *)&pPVar8->field_0x14;
      memmove(pPVar8,pPVar8 + 1,(ulong)uVar7 * 0x18);
      pPVar8 = pPVar8 + (int)uVar7;
      pPVar8->num_bits = FVar2;
      pPVar8->max_bits = FVar3;
      pPVar8->bytes = pFVar1;
      pPVar8->end_point = FVar4;
      *(undefined4 *)&pPVar8->field_0x14 = uVar5;
    }
    table->num_masks = table->num_masks - 1;
  }
  return 0;
}

Assistant:

static FT_Error
  ps_mask_table_merge( PS_Mask_Table  table,
                       FT_UInt        index1,
                       FT_UInt        index2,
                       FT_Memory      memory )
  {
    FT_Error  error = FT_Err_Ok;


    /* swap index1 and index2 so that index1 < index2 */
    if ( index1 > index2 )
    {
      FT_UInt  temp;


      temp   = index1;
      index1 = index2;
      index2 = temp;
    }

    if ( index1 < index2 && index2 < table->num_masks )
    {
      /* we need to merge the bitsets of index1 and index2 with a */
      /* simple union                                             */
      PS_Mask  mask1  = table->masks + index1;
      PS_Mask  mask2  = table->masks + index2;
      FT_UInt  count1 = mask1->num_bits;
      FT_UInt  count2 = mask2->num_bits;
      FT_Int   delta;


      if ( count2 > 0 )
      {
        FT_UInt   pos;
        FT_Byte*  read;
        FT_Byte*  write;


        /* if "count2" is greater than "count1", we need to grow the */
        /* first bitset, and clear the highest bits                  */
        if ( count2 > count1 )
        {
          error = ps_mask_ensure( mask1, count2, memory );
          if ( error )
            goto Exit;

          for ( pos = count1; pos < count2; pos++ )
            ps_mask_clear_bit( mask1, pos );
        }

        /* merge (unite) the bitsets */
        read  = mask2->bytes;
        write = mask1->bytes;
        pos   = ( count2 + 7 ) >> 3;

        for ( ; pos > 0; pos-- )
        {
          write[0] = (FT_Byte)( write[0] | read[0] );
          write++;
          read++;
        }
      }

      /* Now, remove "mask2" from the list.  We need to keep the masks */
      /* sorted in order of importance, so move table elements.        */
      mask2->num_bits  = 0;
      mask2->end_point = 0;

      /* number of masks to move */
      delta = (FT_Int)( table->num_masks - 1 - index2 );
      if ( delta > 0 )
      {
        /* move to end of table for reuse */
        PS_MaskRec  dummy = *mask2;


        ft_memmove( mask2,
                    mask2 + 1,
                    (FT_UInt)delta * sizeof ( PS_MaskRec ) );

        mask2[delta] = dummy;
      }

      table->num_masks--;
    }
    else
      FT_TRACE0(( "ps_mask_table_merge: ignoring invalid indices (%d,%d)\n",
                  index1, index2 ));

  Exit:
    return error;
  }